

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O3

void Abc_CexPrintStatsInputs(Abc_Cex_t *p,int nInputs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar12 [16];
  ulong in_XMM11_Qa;
  uint uVar13;
  undefined8 in_XMM11_Qb;
  uint uVar14;
  uint uVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  
  if (p == (Abc_Cex_t *)0x0) {
    puts("The counter example is NULL.");
    return;
  }
  if (p == (Abc_Cex_t *)0x1) {
    puts("The counter example is present but not available (pointer has value \"1\").");
    return;
  }
  iVar1 = p->nBits;
  if (iVar1 < 1) {
    iVar2 = p->nRegs;
    iVar3 = p->nPis;
    iVar7 = 0;
    iVar5 = 0;
  }
  else {
    iVar2 = p->nRegs;
    iVar3 = p->nPis;
    iVar5 = iVar1 + -1;
    auVar8._4_4_ = iVar5;
    auVar8._0_4_ = iVar5;
    auVar8._8_4_ = iVar5;
    auVar8._12_4_ = iVar5;
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_007ee2e0;
    auVar9 = _DAT_007f4540;
    auVar10 = (undefined1  [16])0x0;
    auVar17 = ZEXT816(0);
    do {
      auVar19 = auVar17;
      auVar15 = auVar10;
      auVar10 = auVar9 ^ _DAT_007ee2e0;
      auVar11._0_4_ = -(uint)(auVar8._0_4_ < auVar10._0_4_);
      auVar11._4_4_ = -(uint)(auVar8._4_4_ < auVar10._4_4_);
      auVar11._8_4_ = -(uint)(auVar8._8_4_ < auVar10._8_4_);
      auVar11._12_4_ = -(uint)(auVar8._12_4_ < auVar10._12_4_);
      if ((~auVar11._0_4_ & 1) != 0) {
        in_XMM11_Qa = (ulong)(uint)(&p[1].iPo)[uVar6 >> 5];
        in_XMM11_Qb = 0;
      }
      auVar10 = auVar11 ^ _DAT_00869ab0;
      if ((auVar10 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        in_XMM11_Qa = CONCAT44((&p[1].iPo)[uVar6 >> 5],(int)in_XMM11_Qa);
      }
      uVar14 = (uint)in_XMM11_Qa;
      if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        in_XMM11_Qb = CONCAT44((int)((ulong)in_XMM11_Qb >> 0x20),(&p[1].iPo)[uVar6 >> 5]);
      }
      auVar16 = auVar10;
      if ((auVar10 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        auVar16._4_4_ = 0;
        auVar16._0_4_ = (&p[1].iPo)[uVar6 >> 5];
        auVar16._8_4_ = (int)in_XMM11_Qb;
        auVar16._12_4_ = (int)((ulong)in_XMM11_Qb >> 0x20);
        in_XMM11_Qb = CONCAT44((&p[1].iPo)[uVar6 >> 5],(int)in_XMM11_Qb);
      }
      if ((~auVar11._0_4_ & 1) != 0) {
        auVar16 = ZEXT416((uint)((int)(uVar6 - iVar2) % iVar3));
      }
      if ((auVar10 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        auVar16._4_4_ = (int)((1 - iVar2) + uVar6) % iVar3;
      }
      if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar16._8_4_ = (int)((2 - iVar2) + uVar6) % iVar3;
      }
      if ((auVar10 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        auVar16._12_4_ = (int)((3 - iVar2) + uVar6) % iVar3;
      }
      auVar20 = auVar9 & _DAT_007f4550;
      auVar17 = pshuflw(auVar16,auVar20,0xfe);
      uVar4 = in_XMM11_Qa >> 0x20;
      auVar10 = pshuflw(in_XMM6,auVar20,0x54);
      uVar18 = (uint)((ulong)in_XMM11_Qb >> 0x20);
      auVar12._0_8_ = auVar20._8_8_;
      auVar12._8_4_ = auVar20._8_4_;
      auVar12._12_4_ = auVar20._12_4_;
      auVar20 = pshuflw(auVar20,auVar12,0xfe);
      uVar21 = uVar18 >> auVar20._0_8_;
      in_XMM6 = pshuflw(auVar12,auVar12,0x54);
      uVar13 = (uint)in_XMM11_Qb >> in_XMM6._0_8_;
      in_XMM11_Qa = CONCAT44(uVar18 >> in_XMM6._0_8_,uVar13);
      in_XMM11_Qb = CONCAT44(uVar21,(uint)in_XMM11_Qb >> auVar20._0_8_);
      uVar14 = uVar14 >> auVar10._0_8_ & 1;
      uVar18 = (uint)uVar4 >> auVar17._0_8_ & 1;
      uVar13 = uVar13 & 1;
      uVar21 = uVar21 & 1;
      auVar10._0_4_ = uVar14 + auVar15._0_4_;
      auVar10._4_4_ = uVar18 + auVar15._4_4_;
      auVar10._8_4_ = uVar13 + auVar15._8_4_;
      auVar10._12_4_ = uVar21 + auVar15._12_4_;
      auVar17._0_4_ = (-(uint)(auVar16._0_4_ < nInputs) & uVar14) + auVar19._0_4_;
      auVar17._4_4_ = (-(uint)(auVar16._4_4_ < nInputs) & uVar18) + auVar19._4_4_;
      auVar17._8_4_ = (-(uint)(auVar16._8_4_ < nInputs) & uVar13) + auVar19._8_4_;
      auVar17._12_4_ = (-(uint)(auVar16._12_4_ < nInputs) & uVar21) + auVar19._12_4_;
      uVar6 = uVar6 + 4;
      auVar20._0_4_ = auVar9._0_4_ + 4;
      auVar20._4_4_ = auVar9._4_4_ + 4;
      auVar20._8_4_ = auVar9._8_4_ + 4;
      auVar20._12_4_ = auVar9._12_4_ + 4;
      auVar9 = auVar20;
    } while ((iVar1 + 3U & 0xfffffffc) != uVar6);
    auVar9 = ~auVar11 & auVar10 | auVar15 & auVar11;
    auVar10 = ~auVar11 & auVar17 | auVar19 & auVar11;
    iVar5 = auVar10._12_4_ + auVar10._4_4_ + auVar10._8_4_ + auVar10._0_4_;
    iVar7 = auVar9._12_4_ + auVar9._4_4_ + auVar9._8_4_ + auVar9._0_4_;
  }
  printf("CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%) 1sIn =%8d (%5.2f %%)\n"
         ,((double)iVar7 * 100.0) / (double)(iVar1 - iVar2),
         ((double)iVar5 * 100.0) / (double)((nInputs - iVar3) * (p->iFrame + 1) + (iVar1 - iVar2)),
         (ulong)(uint)p->iPo);
  return;
}

Assistant:

void Abc_CexPrintStatsInputs( Abc_Cex_t * p, int nInputs )
{
    int k, Counter = 0, Counter2 = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    for ( k = 0; k < p->nBits; k++ )
    {
        Counter += Abc_InfoHasBit(p->pData, k);
        if ( (k - p->nRegs) % p->nPis < nInputs )
            Counter2 += Abc_InfoHasBit(p->pData, k);
    }
    printf( "CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%) 1sIn =%8d (%5.2f %%)\n", 
        p->iPo, p->iFrame, p->nRegs, p->nPis, p->nBits, 
        Counter,  100.0 * Counter  / (p->nBits - p->nRegs), 
        Counter2, 100.0 * Counter2 / (p->nBits - p->nRegs - (p->iFrame + 1) * (p->nPis - nInputs)) );
}